

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

int yy_symbolic_unary(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int yythunkpos556;
  int yypos556;
  int yythunkpos549;
  int yypos549;
  int yythunkpos547;
  int yypos547;
  int yythunkpos545;
  int yypos545;
  int yythunkpos0;
  int yypos0;
  GREG *G_local;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  yyDo(G,yyPush,1,0,"yyPush");
  iVar7 = G->pos;
  iVar3 = G->thunkpos;
  iVar5 = yymatchChar(G,0x2b);
  if (iVar5 != 0) {
    iVar5 = G->pos;
    iVar4 = G->thunkpos;
    iVar6 = yymatchChar(G,0x5e);
    if (iVar6 == 0) {
      G->pos = iVar5;
      G->thunkpos = iVar4;
      iVar5 = yy__(G);
      if ((iVar5 != 0) && (iVar5 = yy_exponentiation_expr(G), iVar5 != 0)) {
        yyDo(G,yySet,-1,0,"yySet");
        yyDo(G,yy_1_symbolic_unary,G->begin,G->end,"yy_1_symbolic_unary");
        goto LAB_0011f611;
      }
    }
  }
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yymatchChar(G,0x2d);
  if (iVar5 != 0) {
    iVar5 = G->pos;
    iVar4 = G->thunkpos;
    iVar6 = yymatchChar(G,0x2d);
    if (iVar6 == 0) {
      G->pos = iVar5;
      G->thunkpos = iVar4;
      iVar5 = yy__(G);
      if ((iVar5 != 0) && (iVar5 = yy_exponentiation_expr(G), iVar5 != 0)) {
        yyDo(G,yySet,-1,0,"yySet");
        yyDo(G,yy_2_symbolic_unary,G->begin,G->end,"yy_2_symbolic_unary");
        goto LAB_0011f611;
      }
    }
  }
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yymatchChar(G,0x21);
  if (((iVar5 == 0) || (iVar5 = yy__(G), iVar5 == 0)) || (iVar5 = yy_symbolic_unary(G), iVar5 == 0))
  {
    G->pos = iVar7;
    G->thunkpos = iVar3;
    iVar5 = yymatchString(G,"+^");
    if (((iVar5 == 0) || (iVar5 = yy__(G), iVar5 == 0)) ||
       (iVar5 = yy_exponentiation_expr(G), iVar5 == 0)) {
      G->pos = iVar7;
      G->thunkpos = iVar3;
      iVar5 = yymatchChar(G,0x7e);
      if (((iVar5 == 0) || (iVar5 = yy__(G), iVar5 == 0)) ||
         (iVar5 = yy_exponentiation_expr(G), iVar5 == 0)) {
        G->pos = iVar7;
        G->thunkpos = iVar3;
        iVar5 = yymatchChar(G,0x3f);
        if (((iVar5 == 0) || (iVar5 = yy__(G), iVar5 == 0)) ||
           (iVar5 = yy_exponentiation_expr(G), iVar5 == 0)) {
          G->pos = iVar7;
          G->thunkpos = iVar3;
          iVar5 = yymatchChar(G,0x5e);
          if (((iVar5 == 0) || (iVar5 = yy__(G), iVar5 == 0)) ||
             (iVar5 = yy_exponentiation_expr(G), iVar5 == 0)) {
            G->pos = iVar7;
            G->thunkpos = iVar3;
            iVar5 = yymatchChar(G,0x7c);
            if (iVar5 != 0) {
              iVar5 = G->pos;
              iVar4 = G->thunkpos;
              iVar6 = yymatchChar(G,0x7c);
              if (iVar6 == 0) {
                G->pos = iVar5;
                G->thunkpos = iVar4;
                iVar5 = yy__(G);
                if ((iVar5 != 0) && (iVar5 = yy_exponentiation_expr(G), iVar5 != 0)) {
                  yyDo(G,yySet,-1,0,"yySet");
                  yyDo(G,yy_8_symbolic_unary,G->begin,G->end,"yy_8_symbolic_unary");
                  goto LAB_0011f611;
                }
              }
            }
            G->pos = iVar7;
            G->thunkpos = iVar3;
            iVar7 = yy_exponentiation_expr(G);
            if (iVar7 == 0) {
              G->pos = iVar1;
              G->thunkpos = iVar2;
              return 0;
            }
          }
          else {
            yyDo(G,yySet,-1,0,"yySet");
            yyDo(G,yy_7_symbolic_unary,G->begin,G->end,"yy_7_symbolic_unary");
          }
        }
        else {
          yyDo(G,yySet,-1,0,"yySet");
          yyDo(G,yy_6_symbolic_unary,G->begin,G->end,"yy_6_symbolic_unary");
        }
      }
      else {
        yyDo(G,yySet,-1,0,"yySet");
        yyDo(G,yy_5_symbolic_unary,G->begin,G->end,"yy_5_symbolic_unary");
      }
    }
    else {
      yyDo(G,yySet,-1,0,"yySet");
      yyDo(G,yy_4_symbolic_unary,G->begin,G->end,"yy_4_symbolic_unary");
    }
  }
  else {
    yyDo(G,yySet,-1,0,"yySet");
    yyDo(G,yy_3_symbolic_unary,G->begin,G->end,"yy_3_symbolic_unary");
  }
LAB_0011f611:
  yyDo(G,yyPop,1,0,"yyPop");
  return 1;
}

Assistant:

YY_RULE(int) yy_symbolic_unary(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 1, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "symbolic_unary"));

  {  int yypos545= G->pos, yythunkpos545= G->thunkpos;  if (!yymatchChar(G, '+')) goto l546;

  {  int yypos547= G->pos, yythunkpos547= G->thunkpos;  if (!yymatchChar(G, '^')) goto l547;
  goto l546;
  l547:;	  G->pos= yypos547; G->thunkpos= yythunkpos547;
  }  if (!yy__(G))  goto l546;
  if (!yy_exponentiation_expr(G))  goto l546;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_1_symbolic_unary, G->begin, G->end, "yy_1_symbolic_unary");
  goto l545;
  l546:;	  G->pos= yypos545; G->thunkpos= yythunkpos545;  if (!yymatchChar(G, '-')) goto l548;

  {  int yypos549= G->pos, yythunkpos549= G->thunkpos;  if (!yymatchChar(G, '-')) goto l549;
  goto l548;
  l549:;	  G->pos= yypos549; G->thunkpos= yythunkpos549;
  }  if (!yy__(G))  goto l548;
  if (!yy_exponentiation_expr(G))  goto l548;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_2_symbolic_unary, G->begin, G->end, "yy_2_symbolic_unary");
  goto l545;
  l548:;	  G->pos= yypos545; G->thunkpos= yythunkpos545;  if (!yymatchChar(G, '!')) goto l550;
  if (!yy__(G))  goto l550;
  if (!yy_symbolic_unary(G))  goto l550;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_3_symbolic_unary, G->begin, G->end, "yy_3_symbolic_unary");
  goto l545;
  l550:;	  G->pos= yypos545; G->thunkpos= yythunkpos545;  if (!yymatchString(G, "+^")) goto l551;
  if (!yy__(G))  goto l551;
  if (!yy_exponentiation_expr(G))  goto l551;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_4_symbolic_unary, G->begin, G->end, "yy_4_symbolic_unary");
  goto l545;
  l551:;	  G->pos= yypos545; G->thunkpos= yythunkpos545;  if (!yymatchChar(G, '~')) goto l552;
  if (!yy__(G))  goto l552;
  if (!yy_exponentiation_expr(G))  goto l552;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_5_symbolic_unary, G->begin, G->end, "yy_5_symbolic_unary");
  goto l545;
  l552:;	  G->pos= yypos545; G->thunkpos= yythunkpos545;  if (!yymatchChar(G, '?')) goto l553;
  if (!yy__(G))  goto l553;
  if (!yy_exponentiation_expr(G))  goto l553;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_6_symbolic_unary, G->begin, G->end, "yy_6_symbolic_unary");
  goto l545;
  l553:;	  G->pos= yypos545; G->thunkpos= yythunkpos545;  if (!yymatchChar(G, '^')) goto l554;
  if (!yy__(G))  goto l554;
  if (!yy_exponentiation_expr(G))  goto l554;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_7_symbolic_unary, G->begin, G->end, "yy_7_symbolic_unary");
  goto l545;
  l554:;	  G->pos= yypos545; G->thunkpos= yythunkpos545;  if (!yymatchChar(G, '|')) goto l555;

  {  int yypos556= G->pos, yythunkpos556= G->thunkpos;  if (!yymatchChar(G, '|')) goto l556;
  goto l555;
  l556:;	  G->pos= yypos556; G->thunkpos= yythunkpos556;
  }  if (!yy__(G))  goto l555;
  if (!yy_exponentiation_expr(G))  goto l555;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_8_symbolic_unary, G->begin, G->end, "yy_8_symbolic_unary");
  goto l545;
  l555:;	  G->pos= yypos545; G->thunkpos= yythunkpos545;  if (!yy_exponentiation_expr(G))  goto l544;

  }
  l545:;	  yyprintf((stderr, "  ok   symbolic_unary"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 1, 0, "yyPop");
  return 1;
  l544:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "symbolic_unary"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}